

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_dumb.cpp
# Opt level: O1

MusInfo * MOD_OpenSong(FileReader *reader)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  int iVar5;
  IT_SAMPLE *pIVar6;
  void *pvVar7;
  uint uVar8;
  byte bVar9;
  BYTE *pBVar10;
  int iVar11;
  uint uVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  DUMBFILE *f;
  DUH *duh;
  DUMB_IT_SIGDATA *pDVar13;
  input_mod *this;
  ulong uVar14;
  char *pcVar15;
  sbyte sVar16;
  ushort uVar17;
  uint uVar18;
  uint uVar19;
  int iVar20;
  uint uVar21;
  uint uVar22;
  long lVar23;
  byte bVar24;
  long lVar25;
  ulong uVar26;
  uint uVar27;
  ulong uVar28;
  int iVar29;
  uint lenfull;
  bool bVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  dumbfile_mem_status filestate;
  FString ver;
  anon_union_64_2_a0bbd727 anon_var_0;
  dumbfile_mem_status local_f0;
  ulong local_e0;
  ulong local_d8;
  long local_d0;
  FString local_c8;
  undefined4 local_bc;
  undefined4 uStack_b8;
  undefined4 uStack_b4;
  char cStack_b0;
  char cStack_af;
  char cStack_ae;
  char cStack_ad;
  char local_ac;
  char cStack_ab;
  char cStack_aa;
  int local_a9;
  char cStack_a5;
  undefined4 uStack_a4;
  char local_9f;
  int local_90;
  int local_7c;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  if (!mod_dumb.Value) {
    return (MusInfo *)0x0;
  }
  addterm(dumb_exit,"dumb_exit");
  lVar25 = reader->Length;
  iVar11 = (*(reader->super_FileReaderBase)._vptr_FileReaderBase[3])(reader);
  local_d0 = CONCAT44(extraout_var,iVar11);
  local_f0.offset = 0;
  lenfull = (uint)lVar25;
  uVar12 = 0x40;
  if ((int)lenfull < 0x40) {
    uVar12 = lenfull;
  }
  local_f0.ptr = (BYTE *)&local_bc;
  iVar11 = (*(reader->super_FileReaderBase)._vptr_FileReaderBase[2])
                     (reader,&local_bc,(long)(int)uVar12);
  if (CONCAT44(extraout_var_00,iVar11) != (long)(int)uVar12) {
    return (MusInfo *)0x0;
  }
  if (local_bc != 0x4d504d49 || (int)lenfull < 4) {
    if (((int)lenfull < 0x11) ||
       (auVar31[0] = -((BYTE)local_bc == 'E'), auVar31[1] = -(local_bc._1_1_ == 'x'),
       auVar31[2] = -(local_bc._2_1_ == 't'), auVar31[3] = -(local_bc._3_1_ == 'e'),
       auVar31[4] = -((char)uStack_b8 == 'n'), auVar31[5] = -(uStack_b8._1_1_ == 'd'),
       auVar31[6] = -(uStack_b8._2_1_ == 'e'), auVar31[7] = -(uStack_b8._3_1_ == 'd'),
       auVar31[8] = -((char)uStack_b4 == ' '), auVar31[9] = -(uStack_b4._1_1_ == 'M'),
       auVar31[10] = -(uStack_b4._2_1_ == 'o'), auVar31[0xb] = -(uStack_b4._3_1_ == 'd'),
       auVar31[0xc] = -(cStack_b0 == 'u'), auVar31[0xd] = -(cStack_af == 'l'),
       auVar31[0xe] = -(cStack_ae == 'e'), auVar31[0xf] = -(cStack_ad == ':'),
       auVar33[0] = -(local_ac == ' '), auVar33[1] = 0xff, auVar33[2] = 0xff, auVar33[3] = 0xff,
       auVar33[4] = 0xff, auVar33[5] = 0xff, auVar33[6] = 0xff, auVar33[7] = 0xff, auVar33[8] = 0xff
       , auVar33[9] = 0xff, auVar33[10] = 0xff, auVar33[0xb] = 0xff, auVar33[0xc] = 0xff,
       auVar33[0xd] = 0xff, auVar33[0xe] = 0xff, auVar33[0xf] = 0xff, auVar33 = auVar33 & auVar31,
       (ushort)((ushort)(SUB161(auVar33 >> 7,0) & 1) | (ushort)(SUB161(auVar33 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar33 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar33 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar33 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar33 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar33 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar33 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar33 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar33 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar33 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar33 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar33 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar33 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar33 >> 0x77,0) & 1) << 0xe |
               (ushort)(byte)(auVar33[0xf] >> 7) << 0xf) != 0xffff)) {
      if (local_90 == 0x4d524353 && 0x2f < (int)lenfull) {
        f = dumb_read_allfile(&local_f0,(BYTE *)&local_bc,reader,uVar12,lenfull);
        if (f != (DUMBFILE *)0x0) {
          duh = dumb_read_s3m_quick(f);
          goto LAB_003365a8;
        }
      }
      else if ((((int)lenfull < 0x490) || (local_9f != '\x02')) ||
              ((CONCAT44(uStack_a4,CONCAT13(cStack_a5,local_a9._1_3_)) != 0x216d616572635321 &&
               ((CONCAT44(uStack_a4,CONCAT13(cStack_a5,local_a9._1_3_)) != 0x4d545332444f4d42 &&
                (CONCAT44(uStack_a4,CONCAT13(cStack_a5,local_a9._1_3_)) != 0x21444f4d415a5557))))))
      {
        if (((int)lenfull < 2) ||
           ((local_bc._1_1_ != 'f' || (BYTE)local_bc != 'i' &&
            (local_bc._1_1_ != 'N' || (BYTE)local_bc != 'J')))) {
          if (local_90 == 0x464d5450 && 0x2f < (int)lenfull) {
            f = dumb_read_allfile(&local_f0,(BYTE *)&local_bc,reader,uVar12,lenfull);
            if (f != (DUMBFILE *)0x0) {
              duh = dumb_read_ptm_quick(f);
              goto LAB_003365a8;
            }
          }
          else if (local_bc == 0x204d5350 && 3 < (int)lenfull) {
            f = dumb_read_allfile(&local_f0,(BYTE *)&local_bc,reader,uVar12,lenfull);
            if (f != (DUMBFILE *)0x0) {
              duh = dumb_read_psm_quick(f,0);
              goto LAB_003365a8;
            }
          }
          else if (local_bc == -0x1b2acb0 && 3 < (int)lenfull) {
            f = dumb_read_allfile(&local_f0,(BYTE *)&local_bc,reader,uVar12,lenfull);
            if (f != (DUMBFILE *)0x0) {
              duh = dumb_read_old_psm_quick(f);
              goto LAB_003365a8;
            }
          }
          else if (((((int)lenfull < 3) || ((BYTE)local_bc != 'M')) || (local_bc._1_1_ != 'T')) ||
                  (local_bc._2_1_ != 'M')) {
            if ((local_bc == 0x46464952 && 0xb < (int)lenfull) &&
               (((uStack_b4 == 0x20204d41 || (uStack_b4 == 0x464d5344)) || (uStack_b4 == 0x46464d41)
                ))) {
              f = dumb_read_allfile(&local_f0,(BYTE *)&local_bc,reader,uVar12,lenfull);
              if (f != (DUMBFILE *)0x0) {
                duh = dumb_read_riff_quick(f);
                goto LAB_003365a8;
              }
            }
            else if ((((int)lenfull < 0x20) ||
                     (auVar34[0] = -(local_bc._3_1_ == 'L'), auVar34[1] = -((char)uStack_b8 == 'U'),
                     auVar34[2] = -(uStack_b8._1_1_ == 'M'), auVar34[3] = -(uStack_b8._2_1_ == ' '),
                     auVar34[4] = -(uStack_b8._3_1_ == 'M'), auVar34[5] = -((char)uStack_b4 == 'u'),
                     auVar34[6] = -(uStack_b4._1_1_ == 's'), auVar34[7] = -(uStack_b4._2_1_ == 'i'),
                     auVar34[8] = -(uStack_b4._3_1_ == 'c'), auVar34[9] = -(cStack_b0 == ' '),
                     auVar34[10] = -(cStack_af == 'F'), auVar34[0xb] = -(cStack_ae == 'o'),
                     auVar34[0xc] = -(cStack_ad == 'r'), auVar34[0xd] = -(local_ac == 'm'),
                     auVar34[0xe] = -(cStack_ab == 'a'), auVar34[0xf] = -(cStack_aa == 't'),
                     auVar32[0] = -((BYTE)local_bc == 'A'), auVar32[1] = -(local_bc._1_1_ == 'S'),
                     auVar32[2] = -(local_bc._2_1_ == 'Y'), auVar32[3] = -(local_bc._3_1_ == 'L'),
                     auVar32[4] = -((char)uStack_b8 == 'U'), auVar32[5] = -(uStack_b8._1_1_ == 'M'),
                     auVar32[6] = -(uStack_b8._2_1_ == ' '), auVar32[7] = -(uStack_b8._3_1_ == 'M'),
                     auVar32[8] = -((char)uStack_b4 == 'u'), auVar32[9] = -(uStack_b4._1_1_ == 's'),
                     auVar32[10] = -(uStack_b4._2_1_ == 'i'),
                     auVar32[0xb] = -(uStack_b4._3_1_ == 'c'), auVar32[0xc] = -(cStack_b0 == ' '),
                     auVar32[0xd] = -(cStack_af == 'F'), auVar32[0xe] = -(cStack_ae == 'o'),
                     auVar32[0xf] = -(cStack_ad == 'r'), auVar32 = auVar32 & auVar34,
                     (ushort)((ushort)(SUB161(auVar32 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar32 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar32 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar32 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar32 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar32 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar32 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar32 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar32 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar32 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar32 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar32 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar32 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar32 >> 0x6f,0) & 1) << 0xd |
                              (ushort)(SUB161(auVar32 >> 0x77,0) & 1) << 0xe |
                             (ushort)(byte)(auVar32[0xf] >> 7) << 0xf) != 0xffff)) ||
                    (cStack_a5 != '0' || local_a9 != 0x2e315620)) {
              f = (DUMBFILE *)0x0;
              if ((7 < (int)lenfull) && (local_bc == 0x41544b4f)) {
                duh = (DUH *)0x0;
                if (uStack_b8 != 0x474e4f53) goto LAB_003365a8;
                f = dumb_read_allfile(&local_f0,(BYTE *)&local_bc,reader,uVar12,lenfull);
                if (f != (DUMBFILE *)0x0) {
                  duh = dumb_read_okt_quick(f);
                  goto LAB_003365a8;
                }
              }
            }
            else {
              f = dumb_read_allfile(&local_f0,(BYTE *)&local_bc,reader,uVar12,lenfull);
              if (f != (DUMBFILE *)0x0) {
                duh = dumb_read_asy_quick(f);
                goto LAB_003365a8;
              }
            }
          }
          else {
            f = dumb_read_allfile(&local_f0,(BYTE *)&local_bc,reader,uVar12,lenfull);
            if (f != (DUMBFILE *)0x0) {
              duh = dumb_read_mtm_quick(f);
              goto LAB_003365a8;
            }
          }
        }
        else {
          f = dumb_read_allfile(&local_f0,(BYTE *)&local_bc,reader,uVar12,lenfull);
          if (f != (DUMBFILE *)0x0) {
            duh = dumb_read_669_quick(f);
            goto LAB_003365a8;
          }
        }
      }
      else {
        f = dumb_read_allfile(&local_f0,(BYTE *)&local_bc,reader,uVar12,lenfull);
        if (f != (DUMBFILE *)0x0) {
          duh = dumb_read_stm_quick(f);
          goto LAB_003365a8;
        }
      }
    }
    else {
      f = dumb_read_allfile(&local_f0,(BYTE *)&local_bc,reader,uVar12,lenfull);
      if (f != (DUMBFILE *)0x0) {
        duh = dumb_read_xm_quick(f);
        goto LAB_003365a8;
      }
    }
  }
  else {
    f = dumb_read_allfile(&local_f0,(BYTE *)&local_bc,reader,uVar12,lenfull);
    if (f != (DUMBFILE *)0x0) {
      duh = dumb_read_it_quick(f);
      goto LAB_003365a8;
    }
  }
  f = (DUMBFILE *)0x0;
  duh = (DUH *)0x0;
LAB_003365a8:
  if (duh == (DUH *)0x0) {
    if (local_f0.ptr == (BYTE *)&local_bc) {
      f = dumb_read_allfile(&local_f0,(BYTE *)&local_bc,reader,uVar12,lenfull);
      if (f == (DUMBFILE *)0x0) {
        (*(reader->super_FileReaderBase)._vptr_FileReaderBase[4])(reader,local_d0,0);
        return (MusInfo *)0x0;
      }
    }
    else {
      local_f0.offset = 0;
    }
    duh = dumb_read_mod_quick(f,1);
  }
  if (f != (DUMBFILE *)0x0) {
    dumbfile_close(f);
  }
  iVar11 = mod_autochip_scan_threshold.Value;
  if (duh == (DUH *)0x0) {
    this = (input_mod *)0x0;
    (*(reader->super_FileReaderBase)._vptr_FileReaderBase[4])(reader,local_d0,0);
  }
  else {
    if (mod_autochip.Value == true) {
      local_d0 = CONCAT44(local_d0._4_4_,mod_autochip_size_force.Value);
      local_7c = mod_autochip_size_scan.Value;
      pDVar13 = duh_get_it_sigdata(duh);
      if ((pDVar13 != (DUMB_IT_SIGDATA *)0x0) && (iVar5 = pDVar13->n_samples, 0 < (long)iVar5)) {
        uVar12 = (int)(iVar11 << 8 | 0x32U) / 100;
        local_d8 = (ulong)uVar12;
        uVar18 = (int)(iVar11 << 0x10 | 0x32U) / 100;
        local_e0 = (ulong)uVar18;
        pIVar6 = pDVar13->sample;
        lVar25 = 0;
        do {
          bVar1 = pIVar6[lVar25].flags;
          if ((bVar1 & 1) != 0) {
            uVar21 = bVar1 & 4;
            iVar11 = pIVar6[lVar25].length;
            if (iVar11 < (int)local_d0) goto LAB_003366ca;
            if (iVar11 < local_7c) {
              uVar27 = ((bVar1 & 4) != 0) + 1;
              uVar14 = (ulong)uVar27;
              if ((bVar1 & 0x50) != 0x10) goto LAB_003367ad;
              sVar16 = (sbyte)(uVar21 >> 2);
              uVar19 = pIVar6[lVar25].loop_start << sVar16;
              iVar29 = pIVar6[lVar25].loop_end << sVar16;
              pvVar7 = pIVar6[lVar25].data;
              lVar23 = (long)(int)uVar19;
              if ((bVar1 & 2) == 0) {
                iVar20 = (int)*(char *)((long)pvVar7 + lVar23) -
                         (int)*(char *)((long)pvVar7 + (long)(int)(iVar29 - uVar27));
                bVar9 = (byte)iVar20;
                bVar24 = -bVar9;
                if (0 < iVar20) {
                  bVar24 = bVar9;
                }
                if ((int)(uint)bVar24 <= (int)uVar12) {
                  if ((bVar1 & 4) != 0) {
                    iVar29 = (int)*(char *)((long)pvVar7 + lVar23 + 1) -
                             (int)*(char *)((long)pvVar7 + (long)iVar29 + -1);
                    bVar9 = (byte)iVar29;
                    bVar24 = -bVar9;
                    if (0 < iVar29) {
                      bVar24 = bVar9;
                    }
                    if ((int)uVar12 < (int)(uint)bVar24) goto LAB_003366ca;
                  }
LAB_003367ad:
                  if ((bVar1 & 0xa0) != 0x20) goto LAB_00336876;
                  sVar16 = (sbyte)(uVar21 >> 2);
                  uVar19 = pIVar6[lVar25].sus_loop_start << sVar16;
                  iVar29 = pIVar6[lVar25].sus_loop_end << sVar16;
                  pvVar7 = pIVar6[lVar25].data;
                  lVar23 = (long)(int)uVar19;
                  if ((bVar1 & 2) == 0) {
                    iVar20 = (int)*(char *)((long)pvVar7 + lVar23) -
                             (int)*(char *)((long)pvVar7 + (long)(int)(iVar29 - uVar27));
                    bVar9 = (byte)iVar20;
                    bVar24 = -bVar9;
                    if (0 < iVar20) {
                      bVar24 = bVar9;
                    }
                    if ((int)(uint)bVar24 <= (int)uVar12) {
                      if ((bVar1 & 4) != 0) {
                        iVar29 = (int)*(char *)((long)pvVar7 + lVar23 + 1) -
                                 (int)*(char *)((long)pvVar7 + (long)iVar29 + -1);
                        bVar9 = (byte)iVar29;
                        bVar24 = -bVar9;
                        if (0 < iVar29) {
                          bVar24 = bVar9;
                        }
                        if ((int)uVar12 < (int)(uint)bVar24) goto LAB_003366ca;
                      }
LAB_00336876:
                      if ((bVar1 & 0x10) != 0) {
                        iVar11 = pIVar6[lVar25].loop_end;
                      }
                      uVar21 = iVar11 << (sbyte)(uVar21 >> 2);
                      uVar26 = uVar14;
                      if ((bVar1 & 2) == 0) {
                        if ((int)uVar27 < (int)uVar21) {
                          lVar23 = 0;
                          do {
                            uVar19 = (int)*(char *)((long)pIVar6[lVar25].data + lVar23) -
                                     (int)*(char *)((long)pIVar6[lVar25].data + uVar26);
                            uVar27 = -uVar19;
                            if (0 < (int)uVar19) {
                              uVar27 = uVar19;
                            }
                            if ((int)uVar12 < (int)(uVar27 & 0xff)) goto LAB_003366ca;
                            uVar26 = uVar26 + uVar14;
                            lVar23 = lVar23 + uVar14;
                          } while ((long)uVar26 < (long)(int)uVar21);
                        }
                        if (((bVar1 & 4) != 0) && (uVar26 = 3, 3 < (int)uVar21)) {
                          uVar26 = 3;
                          do {
                            uVar19 = (int)*(char *)((long)pIVar6[lVar25].data + (uVar26 - 2)) -
                                     (int)*(char *)((long)pIVar6[lVar25].data + uVar26);
                            uVar27 = -uVar19;
                            if (0 < (int)uVar19) {
                              uVar27 = uVar19;
                            }
                          } while (((int)(uVar27 & 0xff) <= (int)uVar12) &&
                                  (uVar26 = uVar26 + 2, uVar26 < uVar21));
                        }
                      }
                      else {
                        if ((int)uVar27 < (int)uVar21) {
                          lVar23 = 0;
                          do {
                            uVar19 = (int)*(short *)((long)pIVar6[lVar25].data + lVar23 * 2) -
                                     (int)*(short *)((long)pIVar6[lVar25].data + uVar26 * 2);
                            uVar27 = -uVar19;
                            if (0 < (int)uVar19) {
                              uVar27 = uVar19;
                            }
                            if ((int)uVar18 < (int)(uVar27 & 0xffff)) goto LAB_003366ca;
                            uVar26 = uVar26 + uVar14;
                            lVar23 = lVar23 + uVar14;
                          } while ((long)uVar26 < (long)(int)uVar21);
                        }
                        if (((bVar1 & 4) != 0) && (uVar26 = 3, 3 < (int)uVar21)) {
                          uVar26 = 3;
                          do {
                            uVar19 = (int)*(short *)((long)pIVar6[lVar25].data + uVar26 * 2 + -4) -
                                     (int)*(short *)((long)pIVar6[lVar25].data + uVar26 * 2);
                            uVar27 = -uVar19;
                            if (0 < (int)uVar19) {
                              uVar27 = uVar19;
                            }
                          } while (((int)(uVar27 & 0xffff) <= (int)uVar18) &&
                                  (uVar26 = uVar26 + 2, uVar26 < uVar21));
                        }
                      }
                      if ((int)uVar21 <= (int)uVar26) goto LAB_003369b4;
                    }
                  }
                  else {
                    uVar22 = (int)*(short *)((long)pvVar7 + lVar23 * 2) -
                             (int)*(short *)((long)pvVar7 + (long)(int)(iVar29 - uVar27) * 2);
                    uVar8 = -uVar22;
                    if (0 < (int)uVar22) {
                      uVar8 = uVar22;
                    }
                    if ((int)(uVar8 & 0xffff) <= (int)uVar18) {
                      if ((bVar1 & 4) != 0) {
                        iVar29 = (int)*(short *)((long)pvVar7 + (long)(int)(uVar19 | 1) * 2) -
                                 (int)*(short *)((long)pvVar7 + (long)iVar29 * 2 + -2);
                        uVar2 = (ushort)iVar29;
                        uVar17 = -uVar2;
                        if (0 < iVar29) {
                          uVar17 = uVar2;
                        }
                        if ((int)uVar18 < (int)(uint)uVar17) goto LAB_003366ca;
                      }
                      goto LAB_00336876;
                    }
                  }
                }
              }
              else {
                uVar22 = (int)*(short *)((long)pvVar7 + lVar23 * 2) -
                         (int)*(short *)((long)pvVar7 + (long)(int)(iVar29 - uVar27) * 2);
                uVar8 = -uVar22;
                if (0 < (int)uVar22) {
                  uVar8 = uVar22;
                }
                if ((int)(uVar8 & 0xffff) <= (int)uVar18) {
                  if ((bVar1 & 4) != 0) {
                    iVar29 = (int)*(short *)((long)pvVar7 + (long)(int)(uVar19 | 1) * 2) -
                             (int)*(short *)((long)pvVar7 + (long)iVar29 * 2 + -2);
                    uVar2 = (ushort)iVar29;
                    uVar17 = -uVar2;
                    if (0 < iVar29) {
                      uVar17 = uVar2;
                    }
                    if ((int)uVar18 < (int)(uint)uVar17) goto LAB_003366ca;
                  }
                  goto LAB_003367ad;
                }
              }
LAB_003366ca:
              pIVar6[lVar25].max_resampling_quality = 0;
            }
          }
LAB_003369b4:
          lVar25 = lVar25 + 1;
        } while (lVar25 != iVar5);
      }
    }
    this = (input_mod *)operator_new(0x88);
    input_mod::input_mod(this,duh);
    iVar11 = (*(this->super_StreamSong).super_MusInfo._vptr_MusInfo[10])(this);
    pBVar10 = local_f0.ptr;
    if ((char)iVar11 == '\0') {
      (*(this->super_StreamSong).super_MusInfo._vptr_MusInfo[1])(this);
      this = (input_mod *)0x0;
    }
    else if (local_bc != 0x4d504d49 || (int)lenfull < 4) {
      pDVar13 = duh_get_it_sigdata(duh);
      if (pDVar13 != (DUMB_IT_SIGDATA *)0x0) {
        this->NumChannels = pDVar13->n_pchannels;
        this->NumPatterns = pDVar13->n_patterns;
        this->NumOrders = pDVar13->n_orders;
        pcVar15 = duh_get_tag(duh,"FORMAT");
        FString::operator=(&this->Codec,pcVar15);
        pcVar15 = duh_get_tag(duh,"TRACKERVERSION");
        FString::operator=(&this->TrackerVersion,pcVar15);
        pcVar15 = duh_get_tag(duh,"FORMATVERSION");
        FString::operator=(&this->FormatVersion,pcVar15);
      }
    }
    else if (((((0xff < lenfull && (int *)local_f0.ptr != (int *)0x0) &&
               (*(int *)local_f0.ptr == 0x4d504d49)) &&
              (*(ushort *)((long)local_f0.ptr + 0x22) < 0x100)) &&
             ((0xf05f < (ushort)(*(ushort *)((long)local_f0.ptr + 0x24) - 0xfa1) &&
              (*(ushort *)((long)local_f0.ptr + 0x20) != 0)))) &&
            ((uint)*(ushort *)((long)local_f0.ptr + 0x20) +
             ((uint)*(ushort *)((long)local_f0.ptr + 0x24) +
              (uint)*(ushort *)((long)local_f0.ptr + 0x22) & 0x3fff) * 4 +
             (uint)*(ushort *)((long)local_f0.ptr + 0x26) * 4 + 0xc0 <= (lenfull & 0x7fffffff))) {
      local_c8.Chars = FString::NullString.Nothing;
      FString::NullString.RefCount = FString::NullString.RefCount + 1;
      FString::Format(&local_c8,"IT v%u.%02x",(ulong)(*(ushort *)((long)local_f0.ptr + 0x2a) >> 8),
                      (ulong)*(ushort *)((long)local_f0.ptr + 0x2a) & 0xff);
      FString::operator=(&this->Codec,&local_c8);
      FString::Format(&local_c8,"%u.%02x",(ulong)(*(ushort *)((long)pBVar10 + 0x28) >> 8),
                      (ulong)*(ushort *)((long)pBVar10 + 0x28) & 0xff);
      FString::operator=(&this->TrackerVersion,&local_c8);
      uVar2 = *(ushort *)((long)pBVar10 + 0x20);
      local_d8 = (ulong)uVar2;
      uVar17 = *(ushort *)((long)pBVar10 + 0x26);
      local_e0 = (ulong)uVar17;
      uVar14 = (ulong)((uint)uVar2 + (uint)uVar17 * 4) +
               (ulong)((uint)*(ushort *)((long)pBVar10 + 0x24) +
                      (uint)*(ushort *)((long)pBVar10 + 0x22)) * 4 + 0xc0;
      uVar12 = (uint)uVar14;
      if (uVar12 < lenfull) {
        uVar18 = uVar12 + (uint)*(ushort *)((long)pBVar10 + uVar14) * 8 + 2;
        uVar14 = (ulong)(uVar12 + 2);
        if (uVar18 < lenfull) {
          uVar14 = (ulong)uVar18;
        }
      }
      uVar26 = uVar14 + 0x1320;
      if ((ulong)(lenfull & 0x7fffffff) <= uVar14 + 0x1320) {
        uVar26 = uVar14;
      }
      if ((*(byte *)((long)pBVar10 + 0x2c) & 0x80) == 0) {
        uVar26 = uVar14;
      }
      uVar12 = (int)uVar26 + 8;
      if ((uVar12 < lenfull) && (*(int *)((long)pBVar10 + uVar26) == 0x4d414e50)) {
        iVar11 = *(int *)((long)pBVar10 + uVar26 + 4);
        uVar18 = iVar11 + uVar12;
        uVar21 = uVar12;
        if (iVar11 - 0x20U < 0x1de1) {
          uVar21 = uVar18;
        }
        uVar26 = (ulong)uVar21;
        if (lenfull < uVar18) {
          uVar26 = (ulong)uVar12;
        }
      }
      uVar18 = (int)uVar26 + 8;
      uVar12 = 0;
      if ((uVar18 < lenfull) && (*(int *)((long)pBVar10 + uVar26) == 0x4d414e43)) {
        uVar21 = *(uint *)((long)pBVar10 + uVar26 + 4);
        uVar12 = uVar21 / 0x14;
        if (0x4ec < uVar21 - 0x14) {
          uVar12 = 0;
        }
        if (lenfull < uVar18 + uVar21) {
          uVar12 = 0;
        }
      }
      if (uVar17 != 0) {
        local_d0 = (long)pBVar10 +
                   (ulong)*(ushort *)((long)pBVar10 + 0x24) * 4 +
                   (ulong)*(ushort *)((long)pBVar10 + 0x22) * 4 + local_d8 + 0xc0;
        uVar14 = 0;
        do {
          local_48 = (undefined1  [16])0x0;
          local_58 = (undefined1  [16])0x0;
          local_68 = (undefined1  [16])0x0;
          local_78 = (undefined1  [16])0x0;
          uVar18 = *(uint *)(local_d0 + uVar14 * 4);
          uVar26 = (ulong)uVar18;
          if (((uVar18 + 4 < lenfull && uVar26 != 0) &&
              (uVar3 = *(ushort *)((long)pBVar10 + uVar26 + 2), 0xff02 < (ushort)(uVar3 - 0x101)))
             && (uVar4 = *(ushort *)((long)pBVar10 + uVar26), uVar18 + uVar4 + 8 <= lenfull)) {
            uVar18 = 0;
            uVar21 = 0;
            do {
              if ((uVar3 <= uVar21) || (uVar4 <= uVar18)) break;
              bVar1 = *(byte *)((long)pBVar10 + (ulong)uVar18 + uVar26 + 8);
              uVar28 = (ulong)uVar18 + 1;
              if (bVar1 == 0) {
                uVar21 = uVar21 + 1;
                bVar30 = false;
              }
              else {
                uVar27 = bVar1 - 1 & 0x3f;
                if ((bVar1 & 0x7f) == 0) {
                  uVar27 = bVar1 & 0x7f;
                }
                if ((char)bVar1 < '\0') {
                  bVar30 = true;
                  if ((uint)uVar4 <= (uint)uVar28) goto LAB_00336d04;
                  local_78[uVar27] = *(undefined1 *)((long)pBVar10 + uVar28 + uVar26 + 8);
                  uVar28 = (ulong)(uVar18 + 2);
                }
                uVar18 = uVar27 + 1;
                if (uVar27 < uVar12) {
                  uVar18 = uVar12;
                }
                bVar1 = local_78[uVar27];
                if ((bVar1 & 0xf) != 0) {
                  uVar12 = uVar18;
                }
                uVar18 = (bVar1 >> 2 & 2) +
                         (bVar1 >> 1 & 1) + (bVar1 & 1) + (int)uVar28 +
                         (uint)((bVar1 >> 2 & 1) != 0);
                uVar28 = (ulong)uVar18;
                bVar30 = uVar4 <= uVar18;
              }
LAB_00336d04:
              uVar18 = (uint)uVar28;
            } while (!bVar30);
          }
          uVar14 = uVar14 + 1;
        } while (uVar14 != local_e0);
      }
      this->NumChannels = uVar12;
      this->NumPatterns = (uint)uVar17;
      this->NumOrders = (uint)uVar2;
      FString::~FString(&local_c8);
    }
  }
  if ((int *)local_f0.ptr != (int *)0x0 && local_f0.ptr != (BYTE *)&local_bc) {
    operator_delete__(local_f0.ptr);
    return (MusInfo *)this;
  }
  return (MusInfo *)this;
}

Assistant:

MusInfo *MOD_OpenSong(FileReader &reader)
{
	DUH *duh = 0;
	int headsize;
	union
	{
		BYTE start[64];
		DWORD dstart[64/4];
	};
	dumbfile_mem_status filestate;
	DUMBFILE *f = NULL;
	long fpos = 0;
	input_mod *state = NULL;

	if (!mod_dumb)
	{
		return NULL;
	}

	bool is_it = false;
	bool is_dos = true;

	atterm(dumb_exit);

    int size = reader.GetLength();
    fpos = reader.Tell();

	filestate.ptr = start;
	filestate.offset = 0;
	headsize = MIN((int)sizeof(start), size);

    if (headsize != reader.Read(start, headsize))
    {
        return NULL;
    }

	if (size >= 4 && dstart[0] == MAKE_ID('I','M','P','M'))
	{
		is_it = true;
		if ((f = dumb_read_allfile(&filestate, start, reader, headsize, size)))
		{
			duh = dumb_read_it_quick(f);
		}
	}
	else if (size >= 17 && !memcmp(start, "Extended Module: ", 17))
	{
		if ((f = dumb_read_allfile(&filestate, start, reader, headsize, size)))
		{
			duh = dumb_read_xm_quick(f);
		}
	}
	else if (size >= 0x30 && dstart[11] == MAKE_ID('S','C','R','M'))
	{
		if ((f = dumb_read_allfile(&filestate, start, reader, headsize, size)))
		{
			duh = dumb_read_s3m_quick(f);
		}
	}
	else if (size >= 1168 &&
		/*start[28] == 0x1A &&*/ start[29] == 2 &&
		( !memcmp( &start[20], "!Scream!", 8 ) ||
		  !memcmp( &start[20], "BMOD2STM", 8 ) ||
		  !memcmp( &start[20], "WUZAMOD!", 8 ) ) )
	{
		if ((f = dumb_read_allfile(&filestate, start, reader, headsize, size)))
		{
			duh = dumb_read_stm_quick(f);
		}
	}
	else if (size >= 2 &&
		((start[0] == 0x69 && start[1] == 0x66) ||
		 (start[0] == 0x4A && start[1] == 0x4E)))
	{
		if ((f = dumb_read_allfile(&filestate, start, reader, headsize, size)))
		{
			duh = dumb_read_669_quick(f);
		}
	}
	else if (size >= 0x30 && dstart[11] == MAKE_ID('P','T','M','F'))
	{
		if ((f = dumb_read_allfile(&filestate, start, reader, headsize, size)))
		{
			duh = dumb_read_ptm_quick(f);
		}
	}
	else if (size >= 4 && dstart[0] == MAKE_ID('P','S','M',' '))
	{
		if ((f = dumb_read_allfile(&filestate, start, reader, headsize, size)))
		{
			duh = dumb_read_psm_quick(f, 0/*start_order*/);
			/*start_order = 0;*/
		}
	}
	else if (size >= 4 && dstart[0] == (DWORD)MAKE_ID('P','S','M',254))
	{
		if ((f = dumb_read_allfile(&filestate, start, reader, headsize, size)))
		{
			duh = dumb_read_old_psm_quick(f);
		}
	}
	else if (size >= 3 && start[0] == 'M' && start[1] == 'T' && start[2] == 'M')
	{
		if ((f = dumb_read_allfile(&filestate, start, reader, headsize, size)))
		{
			duh = dumb_read_mtm_quick(f);
		}
	}
	else if (size >= 12 && dstart[0] == MAKE_ID('R','I','F','F') &&
		(dstart[2] == MAKE_ID('D','S','M','F') ||
		 dstart[2] == MAKE_ID('A','M',' ',' ') ||
		 dstart[2] == MAKE_ID('A','M','F','F')))
	{
		if ((f = dumb_read_allfile(&filestate, start, reader, headsize, size)))
		{
			duh = dumb_read_riff_quick(f);
		}
	}
	else if (size >= 32 &&
		!memcmp( start, "ASYLUM Music Format", 19 ) &&
		!memcmp( start + 19, " V1.0", 5 ) )
	{
		if ((f = dumb_read_allfile(&filestate, start, reader, headsize, size)))
		{
			duh = dumb_read_asy_quick(f);
		}
	}
	else if (size >= 8 &&
		dstart[0] == MAKE_ID('O','K','T','A') &&
		dstart[1] == MAKE_ID('S','O','N','G'))
	{
		if ((f = dumb_read_allfile(&filestate, start, reader, headsize, size)))
		{
			duh = dumb_read_okt_quick(f);
		}
	}

	if ( ! duh )
	{
		is_dos = false;
		if (filestate.ptr == (BYTE *)start)
		{
			if (!(f = dumb_read_allfile(&filestate, start, reader, headsize, size)))
			{
                reader.Seek(fpos, SEEK_SET);
				return NULL;
			}
		}
		else
		{
			filestate.offset = 0;
		}
		// No way to get the filename, so we can't check for a .mod extension, and
		// therefore, trying to load an old 15-instrument SoundTracker module is not
		// safe. We'll restrict MOD loading to 31-instrument modules with known
		// signatures and let the sound system worry about 15-instrument ones.
		// (Assuming it even supports them)
		duh = dumb_read_mod_quick(f, TRUE);
	}

	if (f != NULL)
	{
		dumbfile_close(f);
	}
	if ( duh )
	{
		if (mod_autochip)
		{
			MOD_SetAutoChip(duh);
		}
		state = new input_mod(duh);
		if (!state->IsValid())
		{
			delete state;
			state = NULL;
		}
		else
		{
			if (is_it) ReadIT(filestate.ptr, size, state, false);
			else ReadDUH(duh, state, false, is_dos);
		}
	}
	else
	{
		// Reposition file pointer for other codecs to do their checks.
        reader.Seek(fpos, SEEK_SET);
	}
	if (filestate.ptr != (BYTE *)start)
	{
		delete[] const_cast<BYTE *>(filestate.ptr);
	}
	return state;
}